

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O3

_Bool store_menu_handle(menu *m,ui_event *event,wchar_t oid)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  ui_event_type uVar4;
  keycode_t kVar5;
  _Bool _Var6;
  int iVar7;
  wchar_t wVar8;
  store_context *ctx;
  void *pvVar9;
  menu *m_00;
  char *pcVar10;
  char *pcVar11;
  cmd_code c;
  bool bVar12;
  uint local_34;
  
  ctx = (store_context *)menu_priv(m);
  uVar4 = event->type;
  if (uVar4 != EVT_KBRD) {
    if (uVar4 == EVT_MOUSE) {
      if ((event->mouse).button == '\x01') {
        bVar2 = (event->mouse).y;
        if (bVar2 < 2) {
          bVar3 = (event->mouse).x;
          iVar7 = ctx->store->feat;
          m_00 = menu_dynamic_new();
          pcVar10 = string_make("abcdefghijklmnopqrstuvwxyz");
          m_00->selections = pcVar10;
          menu_dynamic_add_label(m_00,"Inspect inventory",'I',0,pcVar10);
          if (ctx->inspect_only == false) {
            pcVar11 = "Sell";
            if (iVar7 == 0xe) {
              pcVar11 = "Stash";
            }
            menu_dynamic_add_label(m_00,pcVar11,'d',1,pcVar10);
          }
          menu_dynamic_add_label(m_00,"Exit",'`',5,pcVar10);
          msg_flag = false;
          screen_save();
          local_34 = (uint)bVar3;
          menu_dynamic_calc_location(m_00,local_34,(uint)bVar2);
          region_erase_bordered((region_conflict *)&m_00->boundary);
          prt("(Enter to select, ESC) Command:",L'\0',L'\0');
          iVar7 = menu_dynamic_select(m_00);
          menu_dynamic_free(m_00);
          string_free(pcVar10);
          screen_load();
          if (iVar7 == 0) {
            textui_obj_examine();
          }
          else {
            if (iVar7 == 5) {
              return false;
            }
            if (iVar7 == 1) {
              store_sell(ctx);
            }
          }
        }
        else {
          if (oid < L'\0') {
            return false;
          }
          if ((m->active).row + oid != (uint)bVar2) {
            return false;
          }
          context_menu_store_item(ctx,oid,(uint)(event->mouse).x,(uint)bVar2);
        }
        *(byte *)&ctx->flags = (byte)ctx->flags | 3;
        cmdq_pop(CTX_STORE);
        notice_stuff(player);
        handle_stuff(player);
        store_display_recalc(ctx);
        pvVar9 = menu_priv(m);
        menu_setpriv(m,(uint)*(byte *)(*(long *)((long)pvVar9 + 0xb0) + 0x14),pvVar9);
        store_redraw(ctx);
        return true;
      }
    }
    else if (uVar4 == EVT_SELECT) {
      _Var6 = context_menu_store_item(ctx,oid,L'\x01',(m->active).row + oid);
      *(byte *)&ctx->flags = (byte)ctx->flags | 3;
      cmdq_pop(CTX_STORE);
      notice_stuff(player);
      handle_stuff(player);
      if (_Var6) {
        store_display_recalc(ctx);
        pvVar9 = menu_priv(m);
        menu_setpriv(m,(uint)*(byte *)(*(long *)((long)pvVar9 + 0xb0) + 0x14),pvVar9);
        store_redraw(ctx);
        return true;
      }
      return true;
    }
    return false;
  }
  kVar5 = (event->key).code;
  uVar1 = kVar5 - 100;
  if (uVar1 < 0x15) {
    if ((0x1008U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x8001U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x100100U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_001e5b15;
        msg_flag = false;
        prt("Examine which item? (ESC to cancel, Enter to select)",L'\0',L'\0');
        wVar8 = store_get_stock(m,oid);
        prt("",L'\0',L'\0');
        if (L'\xffffffff' < wVar8) {
          store_examine(ctx,wVar8);
        }
      }
      else {
        store_sell(ctx);
      }
    }
    else {
      msg_flag = false;
      pcVar10 = "Purchase which item? (ESC to cancel, Enter to select)";
      if (ctx->store->feat == 0xe) {
        pcVar10 = "Get which item? (Esc to cancel, Enter to select)";
      }
      prt(pcVar10,L'\0',L'\0');
      wVar8 = store_get_stock(m,oid);
      prt("",L'\0',L'\0');
      if (L'\xffffffff' < wVar8) {
        store_purchase(ctx,wVar8,false);
      }
    }
    goto LAB_001e5c25;
  }
LAB_001e5b15:
  if (kVar5 == 0x3d) {
    do_cmd_options();
    pcVar10 = "\x05\x10?={|}~CEIbdegiklpstwx";
    bVar12 = (player->opts).opt[1] != false;
    if (bVar12) {
      pcVar10 = "\x04\x05\x10?={|}~CEIPTdegilpswx";
    }
    pcVar11 = "acfhjmnoqruvyzABDFGHJKLMNOPQRSTUVWXYZ";
    if (bVar12) {
      pcVar11 = "abcfmnoqrtuvyzABDFGHJKLMNOQRSUVWXYZ";
    }
    m->cmd_keys = pcVar10;
    m->selections = pcVar11;
    goto LAB_001e5c25;
  }
  if (kVar5 == 0x3f) {
    ctx->flags = ctx->flags & 0xfffffffcU ^ 7;
    store_display_recalc(ctx);
    store_redraw(ctx);
    goto LAB_001e5c25;
  }
  kVar5 = (event->key).code;
  prt("",L'\0',L'\0');
  msg_flag = false;
  if ((int)kVar5 < 0x54) {
    if ((int)kVar5 < 0x29) {
      if (kVar5 == 4) goto switchD_001e5d5c_caseD_6b;
      if (kVar5 == 5) {
        toggle_inven_equip();
      }
      else {
        if (kVar5 != 0x10) goto switchD_001e5ca9_caseD_75;
        do_cmd_messages();
      }
    }
    else if ((int)kVar5 < 0x49) {
      if (kVar5 == 0x29) {
        do_cmd_save_screen();
      }
      else {
        if (kVar5 != 0x43) goto switchD_001e5ca9_caseD_75;
        do_cmd_change_name();
      }
    }
    else {
      if (kVar5 != 0x49) {
        if (kVar5 == 0x50) goto switchD_001e5d5c_caseD_62;
        goto switchD_001e5ca9_caseD_75;
      }
      textui_obj_examine();
    }
    goto LAB_001e5c25;
  }
  c = CMD_TAKEOFF;
  switch(kVar5) {
  case 0x74:
    break;
  case 0x75:
  case 0x76:
  case 0x78:
  case 0x79:
  case 0x7a:
    goto switchD_001e5ca9_caseD_75;
  case 0x77:
    c = CMD_WIELD;
    break;
  case 0x7b:
    c = CMD_INSCRIBE;
    break;
  case 0x7c:
    do_cmd_quiver();
    goto LAB_001e5c25;
  case 0x7d:
    c = CMD_UNINSCRIBE;
    break;
  case 0x7e:
    textui_browse_knowledge();
    goto LAB_001e5c25;
  default:
    switch(kVar5) {
    case 0x62:
switchD_001e5d5c_caseD_62:
      textui_spell_browse();
      break;
    case 99:
    case 100:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
      goto switchD_001e5ca9_caseD_75;
    case 0x65:
      do_cmd_equip();
      break;
    case 0x69:
      do_cmd_inven();
      break;
    case 0x6b:
switchD_001e5d5c_caseD_6b:
      textui_cmd_ignore();
      break;
    default:
      if (kVar5 == 0x54) goto switchD_001e5ca9_caseD_74;
      goto switchD_001e5ca9_caseD_75;
    }
    goto LAB_001e5c25;
  }
switchD_001e5ca9_caseD_74:
  cmdq_push_repeat(c,L'\0');
LAB_001e5c25:
  cmdq_pop(CTX_STORE);
  event_signal(EVENT_INVENTORY);
  event_signal(EVENT_EQUIPMENT);
  _Var6 = true;
LAB_001e5c46:
  notice_stuff(player);
  handle_stuff(player);
  return _Var6;
switchD_001e5ca9_caseD_75:
  cmdq_pop(CTX_STORE);
  _Var6 = false;
  goto LAB_001e5c46;
}

Assistant:

static bool store_menu_handle(struct menu *m, const ui_event *event, int oid)
{
	bool processed = true;
	struct store_context *ctx = menu_priv(m);
	struct store *store = ctx->store;
	
	if (event->type == EVT_SELECT) {
		/* Hack -- there's no mouse event coordinates to use for */
		/* menu_store_item, so fake one as if mouse clicked on letter */
		bool purchased = context_menu_store_item(ctx, oid, 1, m->active.row + oid);
		ctx->flags |= (STORE_FRAME_CHANGE | STORE_GOLD_CHANGE);

		/* Let the game handle any core commands (equipping, etc) */
		cmdq_pop(CTX_STORE);

		/* Notice and handle stuff */
		notice_stuff(player);
		handle_stuff(player);

		if (purchased) {
			/* Display the store */
			store_display_recalc(ctx);
			store_menu_recalc(m);
			store_redraw(ctx);
		}

		return true;
	} else if (event->type == EVT_MOUSE) {
		if (event->mouse.button == 2) {
			/* exit the store? what already does this? menu_handle_mouse
			 * so exit this so that menu_handle_mouse will be called */
			return false;
		} else if (event->mouse.button == 1) {
			bool action = false;
			if ((event->mouse.y == 0) || (event->mouse.y == 1)) {
				/* show the store context menu */
				if (context_menu_store(ctx, oid, event->mouse.x, event->mouse.y) == false)
					return false;

				action = true;
			} else if ((oid >= 0) && (event->mouse.y == m->active.row + oid)) {
				/* if press is on a list item, so store item context */
				context_menu_store_item(ctx, oid, event->mouse.x,
										event->mouse.y);
				action = true;
			}

			if (action) {
				ctx->flags |= (STORE_FRAME_CHANGE | STORE_GOLD_CHANGE);

				/* Let the game handle any core commands (equipping, etc) */
				cmdq_pop(CTX_STORE);

				/* Notice and handle stuff */
				notice_stuff(player);
				handle_stuff(player);

				/* Display the store */
				store_display_recalc(ctx);
				store_menu_recalc(m);
				store_redraw(ctx);

				return true;
			}
		}
	} else if (event->type == EVT_KBRD) {
		switch (event->key.code) {
			case 's':
			case 'd': store_sell(ctx); break;

			case 'p':
			case 'g':
				/* use the old way of purchasing items */
				msg_flag = false;
				if (store->feat != FEAT_HOME) {
					prt("Purchase which item? (ESC to cancel, Enter to select)",
						0, 0);
				} else {
					prt("Get which item? (Esc to cancel, Enter to select)",
						0, 0);
				}
				oid = store_get_stock(m, oid);
				prt("", 0, 0);
				if (oid >= 0) {
					store_purchase(ctx, oid, false);
				}
				break;
			case 'l':
			case 'x':
				/* use the old way of examining items */
				msg_flag = false;
				prt("Examine which item? (ESC to cancel, Enter to select)",
					0, 0);
				oid = store_get_stock(m, oid);
				prt("", 0, 0);
				if (oid >= 0) {
					store_examine(ctx, oid);
				}
				break;

			case '?': {
				/* Toggle help */
				if (ctx->flags & STORE_SHOW_HELP)
					ctx->flags &= ~(STORE_SHOW_HELP);
				else
					ctx->flags |= STORE_SHOW_HELP;

				/* Redisplay */
				ctx->flags |= STORE_INIT_CHANGE;

				store_display_recalc(ctx);
				store_redraw(ctx);

				break;
			}

			case '=': {
				do_cmd_options();
				store_menu_set_selections(m, false);
				break;
			}

			default:
				processed = store_process_command_key(event->key);
		}

		/* Let the game handle any core commands (equipping, etc) */
		cmdq_pop(CTX_STORE);

		if (processed) {
			event_signal(EVENT_INVENTORY);
			event_signal(EVENT_EQUIPMENT);
		}

		/* Notice and handle stuff */
		notice_stuff(player);
		handle_stuff(player);

		return processed;
	}

	return false;
}